

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdSplitSchnorrSignature(void *handle,char *signature,char **nonce,char **key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  CfdException *pCVar5;
  SchnorrSignature sig;
  char *work_nonce;
  SchnorrSignature local_a8;
  string local_80;
  char *local_60;
  Privkey local_58;
  undefined8 local_38;
  
  local_60 = (char *)0x0;
  local_38 = 0;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(signature);
  if (bVar2) {
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x35f;
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSplitSchnorrSignature";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_a8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_a8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (nonce != (char **)0x0) {
    if (key != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_80,signature,(allocator *)&local_58);
      cfd::core::SchnorrSignature::SchnorrSignature(&local_a8,&local_80);
      paVar1 = &local_80.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      cfd::core::SchnorrSignature::GetNonce((SchnorrPubkey *)&local_58,&local_a8);
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_80,(SchnorrPubkey *)&local_58);
      pcVar3 = cfd::capi::CreateString(&local_80);
      local_60 = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::SchnorrSignature::GetPrivkey(&local_58,&local_a8);
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_80,&local_58);
      pcVar4 = cfd::capi::CreateString(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      *nonce = pcVar3;
      *key = pcVar4;
      if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x36b;
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSplitSchnorrSignature";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,"key is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_a8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Failed to parameter. key is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_a8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x365;
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdSplitSchnorrSignature";
  cfd::core::logger::log<>((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,"nonce is null.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Failed to parameter. nonce is null.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_a8);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSplitSchnorrSignature(
    void* handle, const char* signature, char** nonce, char** key) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_nonce = nullptr;
  char* work_key = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (nonce == nullptr) {
      warn(CFD_LOG_SOURCE, "nonce is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. nonce is null.");
    }
    if (key == nullptr) {
      warn(CFD_LOG_SOURCE, "key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null.");
    }

    SchnorrSignature sig = SchnorrSignature(std::string(signature));
    work_nonce = CreateString(sig.GetNonce().GetHex());
    work_key = CreateString(sig.GetPrivkey().GetHex());

    *nonce = work_nonce;
    *key = work_key;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_nonce, &work_key);
  return result;
}